

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O2

bool __thiscall
Win32MakefileGenerator::processPrlFileBase
          (Win32MakefileGenerator *this,QString *origFile,QStringView origName,QStringView fixedBase
          ,int slashOff)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  QStringView fixedBase_00;
  
  fixedBase_00.m_data = fixedBase.m_data;
  uVar6 = fixedBase.m_size;
  bVar2 = MakefileGenerator::processPrlFileBase
                    (&this->super_MakefileGenerator,origFile,origName,fixedBase,slashOff);
  bVar5 = true;
  if (!bVar2) {
    lVar9 = (long)(int)fixedBase.m_size;
    uVar8 = (ulong)(uint)slashOff;
    lVar7 = (uVar6 << 0x20) + 0x100000000;
    do {
      bVar4 = (byte)uVar8;
      if (lVar9 <= slashOff) goto LAB_001d8626;
      lVar1 = lVar9 + -1;
      lVar9 = lVar9 + -1;
      bVar2 = QChar::isDigit((uint)(ushort)fixedBase_00.m_data[lVar1]);
      bVar4 = (byte)uVar8;
      lVar7 = lVar7 + -0x100000000;
    } while (bVar2);
    uVar8 = lVar7 >> 0x20;
    if (uVar8 == uVar6) {
LAB_001d8626:
      bVar3 = 0;
    }
    else {
      if (uVar6 < uVar8) {
        uVar8 = uVar6;
      }
      fixedBase_00.m_size = uVar8;
      bVar4 = MakefileGenerator::processPrlFileBase
                        (&this->super_MakefileGenerator,origFile,origName,fixedBase_00,slashOff);
      bVar3 = 1;
    }
    bVar5 = (bool)(bVar3 & bVar4);
  }
  return bVar5;
}

Assistant:

bool Win32MakefileGenerator::processPrlFileBase(QString &origFile, QStringView origName,
                                                QStringView fixedBase, int slashOff)
{
    if (MakefileGenerator::processPrlFileBase(origFile, origName, fixedBase, slashOff))
        return true;
    for (int off = fixedBase.size(); off > slashOff; off--) {
        if (!fixedBase.at(off - 1).isDigit()) {
            if (off != fixedBase.size()) {
                return MakefileGenerator::processPrlFileBase(
                            origFile, origName, fixedBase.left(off), slashOff);
            }
            break;
        }
    }
    return false;
}